

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::handleProtectViewport
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  bool bVar1;
  string_view name;
  string_view name_00;
  SourceRange range;
  anon_class_16_2_3edefdfa checkOption;
  PragmaExpressionSyntax *local_30;
  Token local_28;
  anon_class_16_2_3edefdfa local_18;
  
  local_28.info = keyword.info;
  local_28._0_8_ = keyword._0_8_;
  local_30 = args;
  if (args != (PragmaExpressionSyntax *)0x0) {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (((ulong)((long)&(args[3].super_SyntaxNode.previewNode)->kind + 1U) & 0xfffffffffffffffe) ==
        4)) {
      local_18.args = &local_30;
      name._M_str = "object";
      name._M_len = 6;
      local_18.this = this;
      bVar1 = handleProtectViewport::anon_class_16_2_3edefdfa::operator()(&local_18,0,name);
      if (!bVar1) {
        return;
      }
      name_00._M_str = "access";
      name_00._M_len = 6;
      handleProtectViewport::anon_class_16_2_3edefdfa::operator()(&local_18,1,name_00);
      return;
    }
    if (args != (PragmaExpressionSyntax *)0x0) {
      range = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
      goto LAB_001a9491;
    }
  }
  range = Token::range(&local_28);
LAB_001a9491:
  addDiag(this,(DiagCode)0x250004,range);
  return;
}

Assistant:

void Preprocessor::handleProtectViewport(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.size() != 2) {
        addDiag(diag::InvalidPragmaViewport, args ? args->sourceRange() : keyword.range());
        return;
    }

    auto checkOption = [&](size_t index, std::string_view name) {
        auto syntax = args->as<ParenPragmaExpressionSyntax>().values[index];
        if (syntax->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::InvalidPragmaViewport, syntax->sourceRange());
            return false;
        }

        auto& nvp = syntax->as<NameValuePragmaExpressionSyntax>();
        if (nvp.name.valueText() != name) {
            addDiag(diag::InvalidPragmaViewport, nvp.name.range());
            return false;
        }

        if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
            nvp.value->as<SimplePragmaExpressionSyntax>().value.kind != TokenKind::StringLiteral) {
            addDiag(diag::InvalidPragmaViewport, nvp.value->sourceRange());
            return false;
        }

        return true;
    };

    if (!checkOption(0, "object"sv))
        return;

    checkOption(1, "access"sv);
}